

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

void __thiscall antlr::CharScanner::match(CharScanner *this,BitSet *b)

{
  bool bVar1;
  undefined4 uVar2;
  BitSet *pBVar3;
  CharScanner *in_RSI;
  BitSet *in_RDI;
  BitSet *unaff_retaddr;
  int in_stack_0000000c;
  MismatchedCharException *in_stack_00000010;
  int la_1;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined1 matchNot;
  
  pBVar3 = in_RDI;
  uVar2 = (**(code **)((long)(in_RDI->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 0x18)
          )(in_RDI,1);
  matchNot = (undefined1)((ulong)pBVar3 >> 0x38);
  bVar1 = BitSet::member(in_RDI,in_stack_ffffffffffffffa4);
  if (!bVar1) {
    pBVar3 = (BitSet *)__cxa_allocate_exception(0x90);
    BitSet::BitSet((BitSet *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),pBVar3);
    MismatchedCharException::MismatchedCharException
              (in_stack_00000010,in_stack_0000000c,unaff_retaddr,(bool)matchNot,in_RSI);
    __cxa_throw(pBVar3,&MismatchedCharException::typeinfo,
                MismatchedCharException::~MismatchedCharException);
  }
  (**(code **)((long)(in_RDI->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 0x40))();
  return;
}

Assistant:

virtual void match(const BitSet& b)
	{
		int la_1 = LA(1);

		if ( !b.member(la_1) )
			throw MismatchedCharException( la_1, b, false, this );
		consume();
	}